

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_concurrent_hashes
          (ConcurrentDatabase *this,ResourceTag tag,ExportedMetadataConcurrentPrimedBlock *primed,
          uint64_t *total_count)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  ExportedMetadataConcurrentPrimedBlock *pEVar3;
  int iVar4;
  unsigned_long *puVar5;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  pointer puVar6;
  ExportedMetadataConcurrentPrimedBlock *pEVar7;
  size_t hash_count;
  long local_48;
  ExportedMetadataConcurrentPrimedBlock *local_40;
  uint64_t *local_38;
  
  local_48 = 0;
  pDVar1 = (this->readonly_interface)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar1 != (DatabaseInterface *)0x0) {
    iVar4 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48,0);
    if ((char)iVar4 == '\0') {
      return false;
    }
    pDVar1 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar1 != (DatabaseInterface *)0x0) &&
       (iVar4 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48,primed),
       (char)iVar4 == '\0')) {
      return false;
    }
  }
  pEVar7 = primed + local_48;
  puVar6 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = primed;
  local_38 = total_count;
  do {
    pEVar3 = local_40;
    if (puVar6 == puVar2) {
      std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(local_40,pEVar7);
      puVar5 = std::__unique<unsigned_long*,__gnu_cxx::__ops::_Iter_equal_to_iter>(pEVar3,pEVar7);
      *local_38 = (long)puVar5 - (long)pEVar3 >> 3;
      return true;
    }
    local_48 = 0;
    pDVar1 = (puVar6->_M_t).
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar1 != (DatabaseInterface *)0x0) {
      iVar4 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48,0);
      if ((char)iVar4 == '\0') {
        return false;
      }
      pDVar1 = (puVar6->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar1 != (DatabaseInterface *)0x0) &&
         (iVar4 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48), (char)iVar4 == '\0'))
      {
        return false;
      }
    }
    pEVar7 = pEVar7 + local_48;
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

bool write_exported_concurrent_hashes(ResourceTag tag, ExportedMetadataConcurrentPrimedBlock *primed, uint64_t &total_count) const
	{
		auto *primed_begin = primed;
		size_t hash_count = 0;

		// This is an upper bound, we might prune it later, although in general we don't expect duplicates.
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return false;
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, primed))
			return false;
		primed += hash_count;

		for (auto &e : extra_readonly)
		{
			hash_count = 0;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, primed))
				return false;
			primed += hash_count;
		}

		std::sort(primed_begin, primed);
		primed = std::unique(primed_begin, primed);
		total_count = size_t(primed - primed_begin);
		return true;
	}